

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v7::detail::
int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>::
on_dec(int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
       *this)

{
  undefined1 n [16];
  string_view prefix;
  int num_digits_00;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> bVar1;
  char *in_RDI;
  size_t unaff_retaddr;
  back_insert_iterator<fmt::v7::detail::buffer<char>_> in_stack_00000008;
  anon_class_16_2_cb75083a_for_f_conflict1 in_stack_00000020;
  int num_digits;
  undefined8 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  basic_format_specs<char> *in_stack_ffffffffffffffe8;
  char *pcVar2;
  
  n._8_4_ = in_stack_ffffffffffffff98;
  n._0_8_ = in_stack_ffffffffffffff90;
  n._12_4_ = in_stack_ffffffffffffff9c;
  pcVar2 = in_RDI;
  num_digits_00 = count_digits((uint128_t)n);
  get_prefix((int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>_>,_char,_unsigned___int128>
              *)0x17c3e2);
  prefix.size_ = unaff_retaddr;
  prefix.data_ = pcVar2;
  bVar1 = write_int<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,fmt::v7::detail::int_writer<std::back_insert_iterator<fmt::v7::detail::buffer<char>>,char,unsigned__int128>::on_dec()::_lambda(std::back_insert_iterator<fmt::v7::detail::buffer<char>>)_1_>
                    (in_stack_00000008,num_digits_00,prefix,in_stack_ffffffffffffffe8,
                     in_stack_00000020);
  *(buffer<char> **)in_RDI = bVar1.container;
  return;
}

Assistant:

void on_dec() {
    auto num_digits = count_digits(abs_value);
    out = write_int(
        out, num_digits, get_prefix(), specs, [this, num_digits](iterator it) {
          return format_decimal<Char>(it, abs_value, num_digits).end;
        });
  }